

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O1

_Bool room_build(chunk *c,wchar_t by0,wchar_t bx0,room_profile profile,_Bool finds_own_space)

{
  int *piVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  dun_data *pdVar4;
  _Bool _Var5;
  loc_conflict lVar6;
  loc lVar7;
  long lVar8;
  wchar_t by2;
  int iVar9;
  wchar_t wVar10;
  bool bVar11;
  
  iVar9 = profile.height / dun->block_hgt;
  wVar10 = dun->block_wid;
  event_signal_string(EVENT_GEN_ROOM_START,profile.name);
  if ((profile.level <= c->depth) &&
     ((dun->pit_num < (int)(uint)z_info->level_pit_max || (profile.pit == false)))) {
    wVar2 = dun->block_hgt;
    wVar3 = dun->block_wid;
    bVar11 = profile.height % wVar2 != 0;
    wVar10 = (profile.width / wVar10 + bx0 + 1) - (uint)(profile.width % wVar3 == 0);
    if (finds_own_space) {
      lVar6 = loc(c->width,c->height);
      _Var5 = (*profile.builder)(c,lVar6,profile.rating);
      if (_Var5) {
LAB_00153a5a:
        _Var5 = true;
        if (profile.pit != true) goto LAB_001539c2;
        iVar9 = 1;
        lVar8 = 0x78;
        _Var5 = true;
LAB_00153b95:
        piVar1 = (int *)((long)&dun->profile + lVar8);
        *piVar1 = *piVar1 + iVar9;
        goto LAB_001539c2;
      }
    }
    else {
      by2 = iVar9 + by0 + (uint)bVar11;
      _Var5 = check_for_unreserved_blocks(by0,bx0,by2,wVar10);
      if (_Var5) {
        lVar7 = (loc)loc(((bx0 + wVar10 + 1) * wVar3) / 2,((by0 + by2 + 1) * wVar2) / 2);
        if (dun->cent_n < (int)(uint)z_info->level_room_max) {
          dun->cent[dun->cent_n] = lVar7;
          dun->cent_n = dun->cent_n + L'\x01';
        }
        _Var5 = (*profile.builder)(c,(loc_conflict)lVar7,profile.rating);
        pdVar4 = dun;
        if (_Var5) {
          if (by0 <= by2) {
            lVar8 = (long)by0;
            iVar9 = iVar9 + (uint)bVar11 + 1;
            do {
              if (bx0 <= wVar10) {
                memset(pdVar4->room_map[lVar8] + bx0,1,(ulong)(uint)(wVar10 - bx0) + 1);
              }
              lVar8 = lVar8 + 1;
              iVar9 = iVar9 + -1;
            } while (iVar9 != 0);
          }
          goto LAB_00153a5a;
        }
        iVar9 = -1;
        lVar8 = 8;
        _Var5 = false;
        goto LAB_00153b95;
      }
    }
  }
  _Var5 = false;
LAB_001539c2:
  event_signal_flag(EVENT_GEN_ROOM_END,_Var5);
  return _Var5;
}

Assistant:

bool room_build(struct chunk *c, int by0, int bx0, struct room_profile profile,
	bool finds_own_space)
{
	/* Extract blocks */
	int by1 = by0;
	int bx1 = bx0;
	int by2 = by0 + profile.height / dun->block_hgt;
	int bx2 = bx0 + profile.width / dun->block_wid;

	struct loc centre;

	event_signal_string(EVENT_GEN_ROOM_START, profile.name);
	/* Enforce the room profile's minimum depth */
	if (c->depth < profile.level) {
		event_signal_flag(EVENT_GEN_ROOM_END, false);
		return false;
	}

	/* Only allow at most two pit/nests room per level */
	if ((dun->pit_num >= z_info->level_pit_max) && (profile.pit)) {
		event_signal_flag(EVENT_GEN_ROOM_END, false);
		return false;
	}

	/* Expand the number of blocks if we might overflow */
	if (profile.height % dun->block_hgt) by2++;
	if (profile.width % dun->block_wid) bx2++;

	/* Does the profile allocate space, or the room find it? */
	if (finds_own_space) {
		/* Try to build a room, pass silly place so room finds its own */
		if (!profile.builder(c, loc(c->width, c->height),
				profile.rating)) {
			event_signal_flag(EVENT_GEN_ROOM_END, false);
			return false;
		}
	} else {
		if (!check_for_unreserved_blocks(by1, bx1, by2, bx2)) {
			event_signal_flag(EVENT_GEN_ROOM_END, false);
			return false;
		}

		/* Get the location of the room */
		centre = loc(((bx1 + bx2 + 1) * dun->block_wid) / 2,
					 ((by1 + by2 + 1) * dun->block_hgt) / 2);

		/* Save the room location (must be before builder call to
		 * properly store entrance information). */
		if (dun->cent_n < z_info->level_room_max) {
			dun->cent[dun->cent_n] = centre;
			dun->cent_n++;
		}

		/* Try to build a room */
		if (!profile.builder(c, centre, profile.rating)) {
			--dun->cent_n;
			event_signal_flag(EVENT_GEN_ROOM_END, false);
			return false;
		}

		reserve_blocks(by1, bx1, by2, bx2);
	}

	/* Count pit/nests rooms */
	if (profile.pit) dun->pit_num++;

	/* Success */
	event_signal_flag(EVENT_GEN_ROOM_END, true);
	return true;
}